

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_uint.h
# Opt level: O1

bool __thiscall jbcoin::base_uint<128UL,_void>::SetHexExact(base_uint<128UL,_void> *this,char *psz)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  
  bVar5 = false;
  uVar4 = 0;
  do {
    iVar2 = charUnHex(*psz);
    if (iVar2 == -1) {
      psz = (char *)((uchar *)psz + 1);
      bVar6 = false;
    }
    else {
      puVar1 = (uchar *)psz + 1;
      psz = (char *)((uchar *)psz + 2);
      iVar3 = charUnHex(*puVar1);
      bVar6 = iVar3 != -1;
      if (bVar6) {
        *(byte *)this->pn = (byte)iVar3 | (byte)(iVar2 << 4);
        this = (base_uint<128UL,_void> *)((long)this->pn + 1);
        bVar6 = true;
      }
    }
    if (!bVar6) break;
    bVar5 = 0xe < uVar4;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x10);
  if (bVar5) {
    bVar5 = *psz == '\0';
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool SetHexExact (const char* psz)
    {
        unsigned char* pOut  = begin ();

        assert(sizeof(pn) == bytes);
        for (int i = 0; i < sizeof (pn); ++i)
        {
            auto hi = charUnHex(*psz++);
            if (hi == -1)
                return false;

            auto lo = charUnHex (*psz++);
            if (lo == -1)
                return false;

            *pOut++ = (hi << 4) | lo;
        }

        // We've consumed exactly as many bytes as we needed at this point
        // so we should be at the end of the string.
        return (*psz == 0);
    }